

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

void * rw::d3d::createTexture(int32 width,int32 height,int32 numlevels,uint32 usage,uint32 format)

{
  uint32 uVar1;
  int32 *piVar2;
  int local_44;
  int32 i_1;
  RasterLevels *levels;
  uint8 *data;
  int local_28;
  int32 i;
  int32 size;
  int32 h;
  int32 w;
  uint32 format_local;
  uint32 usage_local;
  int32 numlevels_local;
  int32 height_local;
  int32 width_local;
  
  local_28 = 0;
  i = height;
  size = width;
  for (data._4_4_ = 0; data._4_4_ < numlevels; data._4_4_ = data._4_4_ + 1) {
    uVar1 = calculateTextureSize(size,i,1,format);
    local_28 = uVar1 + local_28;
    size = size / 2;
    if (size == 0) {
      size = 1;
    }
    i = i / 2;
    if (i == 0) {
      i = 1;
    }
  }
  piVar2 = (int32 *)mustmalloc_LOC((long)(numlevels + -1) * 0x18 + 0x20 + (long)local_28,0x30b00,
                                   "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d.cpp line: 231"
                                  );
  levels = (RasterLevels *)(piVar2 + (long)(numlevels + -1) * 6 + 8);
  *piVar2 = numlevels;
  piVar2[1] = format;
  i = height;
  size = width;
  for (local_44 = 0; local_44 < numlevels; local_44 = local_44 + 1) {
    piVar2[(long)local_44 * 6 + 2] = size;
    piVar2[(long)local_44 * 6 + 3] = i;
    *(RasterLevels **)(piVar2 + (long)local_44 * 6 + 6) = levels;
    uVar1 = calculateTextureSize(size,i,1,format);
    piVar2[(long)local_44 * 6 + 4] = uVar1;
    levels = (RasterLevels *)((long)levels->levels + (long)piVar2[(long)local_44 * 6 + 4] + -8);
    size = size / 2;
    if (size == 0) {
      size = 1;
    }
    i = i / 2;
    if (i == 0) {
      i = 1;
    }
  }
  return piVar2;
}

Assistant:

void*
createTexture(int32 width, int32 height, int32 numlevels, uint32 usage, uint32 format)
{
#ifdef RW_D3D9
	IDirect3DTexture9 *tex;
	d3ddevice->CreateTexture(width, height, numlevels, usage,
	                      (D3DFORMAT)format, D3DPOOL_MANAGED, &tex, nil);
	if(tex)
		d3d9Globals.numTextures++;
	return tex;
#else
	int32 w = width;
	int32 h = height;
	int32 size = 0;
	for(int32 i = 0; i < numlevels; i++){
		size += calculateTextureSize(w, h, 1, format);
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	uint8 *data = (uint8*)rwNew(sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1)+size,
		MEMDUR_EVENT | ID_DRIVER);
	RasterLevels *levels = (RasterLevels*)data;
	data += sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1);
	levels->numlevels = numlevels;
	levels->format = format;
	w = width;
	h = height;
	for(int32 i = 0; i < numlevels; i++){
		levels->levels[i].width = w;
		levels->levels[i].height = h;
		levels->levels[i].data = data;
		levels->levels[i].size = calculateTextureSize(w, h, 1, format);
		data += levels->levels[i].size;
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	return levels;
#endif
}